

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O1

void tcp_listener_doclose(tcp_listener *l)

{
  nni_aio *aio;
  
  l->closed = true;
  aio = (nni_aio *)nni_list_first(&l->acceptq);
  while (aio != (nni_aio *)0x0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    aio = (nni_aio *)nni_list_first(&l->acceptq);
  }
  nni_posix_pfd_close(&l->pfd);
  return;
}

Assistant:

static void
tcp_listener_doclose(tcp_listener *l)
{
	nni_aio *aio;

	l->closed = true;
	while ((aio = nni_list_first(&l->acceptq)) != NULL) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_posix_pfd_close(&l->pfd);
}